

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void change_extension_to_ply(char *new_filename,char *filename)

{
  int iVar1;
  int iVar2;
  int local_28;
  int local_24;
  int find_last_dot;
  int filename_length;
  char *filename_ptr;
  char *filename_local;
  char *new_filename_local;
  
  local_24 = 0;
  _find_last_dot = filename;
  while (iVar2 = local_24, *_find_last_dot != '\0') {
    new_filename[local_24] = *_find_last_dot;
    local_24 = local_24 + 1;
    _find_last_dot = _find_last_dot + 1;
  }
  do {
    iVar1 = iVar2;
    local_28 = iVar1 + -1;
    if (local_28 == 0) break;
    iVar2 = local_28;
  } while (new_filename[local_28] != '.');
  if (new_filename[local_28] == '.') {
    new_filename[iVar1] = 'p';
    new_filename[iVar1 + 1] = 'l';
    new_filename[iVar1 + 2] = 'y';
    new_filename[iVar1 + 3] = '\0';
  }
  else {
    new_filename[local_24] = '.';
    new_filename[local_24 + 1] = 'p';
    new_filename[local_24 + 2] = 'l';
    new_filename[local_24 + 3] = 'y';
    new_filename[local_24 + 4] = '\0';
  }
  return;
}

Assistant:

static void change_extension_to_ply(char* new_filename, const char* filename)
  {
  const char* filename_ptr = filename;
  int filename_length = 0;
  while (*filename_ptr)
    new_filename[filename_length++] = *filename_ptr++;

  int find_last_dot = filename_length - 1;
  while (find_last_dot)
    {
    if (new_filename[find_last_dot] == '.')
      break;
    --find_last_dot;
    }
  if (new_filename[find_last_dot] == '.')
    {
    new_filename[find_last_dot + 1] = 'p';
    new_filename[find_last_dot + 2] = 'l';
    new_filename[find_last_dot + 3] = 'y';
    new_filename[find_last_dot + 4] = 0;
    }
  else
    {
    new_filename[filename_length + 0] = '.';
    new_filename[filename_length + 1] = 'p';
    new_filename[filename_length + 2] = 'l';
    new_filename[filename_length + 3] = 'y';
    new_filename[filename_length + 4] = 0;
    }
  }